

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O0

void __thiscall Assimp::IFC::Schema_2x3::IfcRelDefines::~IfcRelDefines(IfcRelDefines *this)

{
  ~IfcRelDefines((IfcRelDefines *)&this[-1].field_0x40);
  return;
}

Assistant:

IfcRelDefines() : Object("IfcRelDefines") {}